

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_listp_op(sexp ctx,sexp self,sexp_sint_t n,sexp hare)

{
  sexp psVar1;
  bool bVar2;
  
  if ((((ulong)hare & 3) == 0) && (hare->tag == 6)) {
    psVar1 = (hare->value).type.cpl;
    if (((ulong)psVar1 & 3) == 0) {
      while (psVar1->tag == 6) {
        if (psVar1 == hare) {
          return (sexp)&DAT_0000003e;
        }
        psVar1 = (psVar1->value).type.cpl;
        if ((((ulong)psVar1 & 3) != 0) ||
           ((psVar1->tag == 6 && (psVar1 = (psVar1->value).type.cpl, ((ulong)psVar1 & 3) != 0))))
        break;
        hare = (hare->value).type.cpl;
      }
    }
    bVar2 = psVar1 == (sexp)&DAT_0000023e;
  }
  else {
    bVar2 = hare == (sexp)&DAT_0000023e;
  }
  return (sexp)((ulong)bVar2 << 8 | 0x3e);
}

Assistant:

sexp sexp_listp_op (sexp ctx, sexp self, sexp_sint_t n, sexp hare) {
  sexp turtle;
  if (! sexp_pairp(hare))
    return sexp_make_boolean(sexp_nullp(hare));
  turtle = hare;
  hare = sexp_cdr(hare);
  for ( ; sexp_pairp(hare); turtle=sexp_cdr(turtle)) {
    if (hare == turtle) return SEXP_FALSE;
    hare = sexp_cdr(hare);
    if (sexp_pairp(hare)) hare = sexp_cdr(hare);
  }
  return sexp_make_boolean(sexp_nullp(hare));
}